

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  GLboolean GVar1;
  size_type sVar2;
  reference data;
  long _code;
  DILogger local_ae8;
  DILogger local_968;
  DILogger local_7e8;
  DILogger local_668;
  undefined4 local_4e4;
  DILogger local_4e0;
  void *local_360;
  void *buf;
  void *local_1d8;
  void *ptr;
  int dataHeight;
  int dataWidth;
  CDataArray dataRef;
  undefined1 local_1a0 [8];
  DIResult result;
  CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  result.status_ = (long)this;
  DIResult::DIResult((DIResult *)local_1a0);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,(int *)((long)&ptr + 4),(int *)&ptr);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,ptr._4_4_,(uint)ptr,
             0x1e,0x32);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  data = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,data,0x88e8);
  local_1d8 = (void *)0x0;
  glu::CallLogWrapper::glGetBufferPointerv
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,0x88bd,&local_1d8);
  if (local_1d8 != (void *)0x0) {
    DIResult::error((DILogger *)&buf,(DIResult *)local_1a0);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&buf,
               (char (*) [109])
               "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned invalid pointer, expected: NULL"
              );
    DILogger::~DILogger((DILogger *)&buf);
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  local_360 = glu::CallLogWrapper::glMapBufferRange
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8f3f,0,sVar2 << 2,1);
  if (local_360 == (void *)0x0) {
    DIResult::error(&local_4e0,(DIResult *)local_1a0);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_4e0,
               (char (*) [73])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL");
    DILogger::~DILogger(&local_4e0);
    this_local = (CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::ES3> *)
                 DIResult::code((DIResult *)local_1a0);
  }
  else {
    glu::CallLogWrapper::glGetBufferPointerv
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0x88bd,&local_1d8);
    if (local_1d8 == (void *)0x0) {
      DIResult::error(&local_668,(DIResult *)local_1a0);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_668,
                 (char (*) [82])
                 "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned NULL"
                );
      DILogger::~DILogger(&local_668);
    }
    if (local_1d8 != (void *)0x0) {
      _code = DrawIndirectBase::BufferCheck
                        (&this->super_DrawIndirectBase,(CDataArray *)&dataHeight,ptr._4_4_,(uint)ptr
                         ,local_1d8,ptr._4_4_,(uint)ptr,0,0);
      DIResult::sub_result(&local_7e8,(DIResult *)local_1a0,_code);
      DILogger::~DILogger(&local_7e8);
    }
    if (local_1d8 != local_360) {
      DIResult::error(&local_968,(DIResult *)local_1a0);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_968,
                 (char (*) [128])
                 "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) different pointer than glMapBuffer(GL_DRAW_INDIRECT_BUFFER)"
                );
      DILogger::~DILogger(&local_968);
    }
    GVar1 = glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8f3f);
    if (GVar1 == '\0') {
      DIResult::error(&local_ae8,(DIResult *)local_1a0);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_ae8,
                 (char (*) [75])
                 "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE");
      DILogger::~DILogger(&local_ae8);
    }
    local_360 = (void *)0x0;
    local_1d8 = (void *)0x0;
    this_local = (CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::ES3> *)
                 DIResult::code((DIResult *)local_1a0);
  }
  local_4e4 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  DIResult::~DIResult((DIResult *)local_1a0);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		void* ptr = 0;
		glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER, &ptr);

		if (ptr != 0)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned invalid "
							  "pointer, expected: NULL";
		}

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)),
									 GL_MAP_READ_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL";

			return result.code();
		}

		glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER, &ptr);

		if (ptr == 0)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned NULL";
		}

		if (ptr)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, ptr, dataWidth, dataHeight));
		}

		if (ptr != buf)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) different pointer "
							  "than glMapBuffer(GL_DRAW_INDIRECT_BUFFER)";
		}

		if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
		{
			result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
		}
		buf = 0;
		ptr = 0;

		return result.code();
	}